

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

bool __thiscall sptk::SymmetricMatrix::Invert(SymmetricMatrix *this,SymmetricMatrix *inverse_matrix)

{
  bool bVar1;
  reference ppdVar2;
  size_type __n;
  reference pvVar3;
  long in_RSI;
  long in_RDI;
  double dVar4;
  int k_1;
  double sum;
  int j_1;
  int i_2;
  int i_1;
  vector<double,_std::allocator<double>_> inverse_diagonal_elements;
  int k;
  int j;
  int i;
  vector<double,_std::allocator<double>_> diagonal_elements;
  SymmetricMatrix lower_triangular_matrix;
  SymmetricMatrix *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffed8;
  SymmetricMatrix *in_stack_fffffffffffffee0;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef8;
  double dVar5;
  SymmetricMatrix *in_stack_ffffffffffffff00;
  SymmetricMatrix *in_stack_ffffffffffffff08;
  int local_cc;
  double local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  undefined1 local_b1 [29];
  int local_94;
  int local_90;
  int local_8c;
  undefined4 local_88;
  vector<double,_std::allocator<double>_> local_70 [2];
  vector<double_*,_std::allocator<double_*>_> vStack_30;
  long local_18;
  byte local_1;
  
  if ((in_RSI == 0) || (in_RDI == in_RSI)) {
    local_1 = 0;
  }
  else {
    local_18 = in_RSI;
    if (*(int *)(in_RSI + 8) != *(int *)(in_RDI + 8)) {
      Resize(in_stack_fffffffffffffee0,(int)(in_stack_fffffffffffffed8 >> 0x20));
    }
    SymmetricMatrix(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    std::allocator<double>::allocator((allocator<double> *)0x11cd5b);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::allocator<double>::~allocator((allocator<double> *)0x11cd81);
    bVar1 = CholeskyDecomposition
                      (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
                      );
    if (bVar1) {
      local_8c = *(int *)(in_RDI + 8);
      while (local_8c = local_8c + -1, -1 < local_8c) {
        ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                             (long)local_8c);
        (*ppdVar2)[local_8c] = 1.0;
        local_90 = local_8c;
        while (local_90 = local_90 + 1, local_90 < *(int *)(in_RDI + 8)) {
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              (&vStack_30,(long)local_90);
          dVar4 = (*ppdVar2)[local_8c];
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                               (long)local_8c);
          dVar4 = dVar4 * (*ppdVar2)[local_8c];
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                               (long)local_90);
          (*ppdVar2)[local_8c] = dVar4;
          local_94 = local_8c;
          while (local_94 = local_94 + 1, local_94 < local_90) {
            ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                (&vStack_30,(long)local_90);
            dVar4 = (*ppdVar2)[local_94];
            ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                                 (long)local_94);
            dVar5 = (*ppdVar2)[local_8c];
            ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                                 (long)local_90);
            (*ppdVar2)[local_8c] = dVar4 * dVar5 + (*ppdVar2)[local_8c];
          }
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                               (long)local_90);
          dVar4 = (*ppdVar2)[local_90];
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                               (long)local_90);
          (*ppdVar2)[local_8c] = -dVar4 * (*ppdVar2)[local_8c];
        }
      }
      __n = (size_type)*(int *)(in_RDI + 8);
      this_00 = (vector<double,_std::allocator<double>_> *)local_b1;
      std::allocator<double>::allocator((allocator<double> *)0x11d0b0);
      std::vector<double,_std::allocator<double>_>::vector(this_00,__n,in_stack_fffffffffffffed0);
      std::allocator<double>::~allocator((allocator<double> *)0x11d0d6);
      for (local_b8 = 0; local_b8 < *(int *)(in_RDI + 8); local_b8 = local_b8 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_70,(long)local_b8);
        in_stack_fffffffffffffed0 = (allocator_type *)(1.0 / *pvVar3);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_b1 + 1),(long)local_b8
                           );
        *pvVar3 = (value_type)in_stack_fffffffffffffed0;
      }
      for (local_bc = 0; local_bc < *(int *)(in_RDI + 8); local_bc = local_bc + 1) {
        for (local_c0 = 0; local_c0 <= local_bc; local_c0 = local_c0 + 1) {
          local_c8 = 0.0;
          for (local_cc = local_bc; local_cc < *(int *)(in_RDI + 8); local_cc = local_cc + 1) {
            ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                                 (long)local_cc);
            in_stack_fffffffffffffec0 = (SymmetricMatrix *)(*ppdVar2)[local_bc];
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_b1 + 1),
                                (long)local_cc);
            dVar4 = (double)in_stack_fffffffffffffec0 * *pvVar3;
            ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                                ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                                 (long)local_cc);
            local_c8 = dVar4 * (*ppdVar2)[local_c0] + local_c8;
          }
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(local_18 + 0x28),
                               (long)local_bc);
          (*ppdVar2)[local_c0] = local_c8;
        }
      }
      local_1 = 1;
      local_88 = 1;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
    }
    else {
      local_1 = 0;
      local_88 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
    ~SymmetricMatrix(in_stack_fffffffffffffec0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SymmetricMatrix::Invert(SymmetricMatrix* inverse_matrix) const {
  if (NULL == inverse_matrix || this == inverse_matrix) {
    return false;
  }

  if (inverse_matrix->num_dimension_ != num_dimension_) {
    inverse_matrix->Resize(num_dimension_);
  }

  SymmetricMatrix lower_triangular_matrix(num_dimension_);
  std::vector<double> diagonal_elements(num_dimension_);
  if (!CholeskyDecomposition(&lower_triangular_matrix, &diagonal_elements)) {
    return false;
  }

  for (int i(num_dimension_ - 1); 0 <= i; --i) {
    inverse_matrix->index_[i][i] = 1.0;
    for (int j(i + 1); j < num_dimension_; ++j) {
      inverse_matrix->index_[j][i] =
          lower_triangular_matrix.index_[j][i] * inverse_matrix->index_[i][i];
      for (int k(i + 1); k < j; ++k) {
        inverse_matrix->index_[j][i] +=
            lower_triangular_matrix.index_[j][k] * inverse_matrix->index_[k][i];
      }
      inverse_matrix->index_[j][i] *= -inverse_matrix->index_[j][j];
    }
  }

  std::vector<double> inverse_diagonal_elements(num_dimension_);
  for (int i(0); i < num_dimension_; ++i) {
    inverse_diagonal_elements[i] = 1.0 / diagonal_elements[i];
  }

  for (int i(0); i < num_dimension_; ++i) {
    for (int j(0); j <= i; ++j) {
      double sum(0.0);
      for (int k(i); k < num_dimension_; ++k) {
        sum += inverse_matrix->index_[k][i] * inverse_diagonal_elements[k] *
               inverse_matrix->index_[k][j];
      }
      inverse_matrix->index_[i][j] = sum;
    }
  }

  return true;
}